

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_fflags.c
# Opt level: O0

void test_option_fflags(void)

{
  wchar_t wVar1;
  int r;
  
  wVar1 = canNodump();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                   ,L'+');
    test_skipping("Can\'t test nodump flag on this filesystem");
  }
  else {
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'0',"f",L'Ƥ',L'\xffffffff',"a");
    assertion_set_nodump
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
               ,L'3',"f");
    chmod("f",0x1a4);
    wVar1 = systemf("%s -c --fflags -f fflags.tar f >fflags.out 2>fflags.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L':',(long)wVar1,"r",0,"0",(void *)0x0);
    wVar1 = systemf("%s -c --no-fflags -f nofflags.tar f >nofflags.out 2>nofflags.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'>',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                       ,L'A',"fflags_fflags",L'ǭ');
    clear_fflags("fflags_fflags");
    wVar1 = systemf("%s -x -C fflags_fflags --no-same-permissions --fflags -f fflags.tar >fflags_fflags.out 2>fflags_fflags.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'D',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_compare_fflags
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
               ,L'E',"f","fflags_fflags/f",L'\0');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                       ,L'H',"fflags_nofflags",L'ǭ');
    clear_fflags("fflags_nofflags");
    wVar1 = systemf("%s -x -C fflags_nofflags -p --no-fflags -f fflags.tar >fflags_nofflags.out 2>fflags_nofflags.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'K',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_compare_fflags
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
               ,L'L',"f","fflags_nofflags/f",L'\x01');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                       ,L'O',"nofflags_fflags",L'ǭ');
    clear_fflags("nofflags_fflags");
    wVar1 = systemf("%s -x -C nofflags_fflags --no-same-permissions --fflags -f nofflags.tar >nofflags_fflags.out 2>nofflags_fflags.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'R',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_compare_fflags
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
               ,L'S',"f","nofflags_fflags/f",L'\x01');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                       ,L'V',"nofflags_nofflags",L'ǭ');
    clear_fflags("nofflags_nofflags");
    wVar1 = systemf("%s -x -C nofflags_nofflags -p --no-fflags -f nofflags.tar >nofflags_nofflags.out 2>nofflags_nofflags.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
                        ,L'Y',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_compare_fflags
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_fflags.c"
               ,L'Z',"f","nofflags_nofflags/f",L'\x01');
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_fflags)
{
	int r;

	if (!canNodump()) {
		skipping("Can't test nodump flag on this filesystem");
		return;
	}

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Set nodump flag on the file */
	assertSetNodump("f");

	/* FreeBSD ZFS workaround: ZFS sets uarch on all touched files and dirs */
	chmod("f", 0644);

	/* Archive it with fflags */
	r = systemf("%s -c --fflags -f fflags.tar f >fflags.out 2>fflags.err", testprog);
	assertEqualInt(r, 0);

	/* Archive it without fflags */
	r = systemf("%s -c --no-fflags -f nofflags.tar f >nofflags.out 2>nofflags.err", testprog);
	assertEqualInt(r, 0);

	/* Extract fflags with fflags */
	assertMakeDir("fflags_fflags", 0755);
	clear_fflags("fflags_fflags");
	r = systemf("%s -x -C fflags_fflags --no-same-permissions --fflags -f fflags.tar >fflags_fflags.out 2>fflags_fflags.err", testprog);
	assertEqualInt(r, 0);
	assertEqualFflags("f", "fflags_fflags/f");

	/* Extract fflags without fflags */
	assertMakeDir("fflags_nofflags", 0755);
	clear_fflags("fflags_nofflags");
	r = systemf("%s -x -C fflags_nofflags -p --no-fflags -f fflags.tar >fflags_nofflags.out 2>fflags_nofflags.err", testprog);
	assertEqualInt(r, 0);
	assertUnequalFflags("f", "fflags_nofflags/f");

	/* Extract nofflags with fflags */
	assertMakeDir("nofflags_fflags", 0755);
	clear_fflags("nofflags_fflags");
	r = systemf("%s -x -C nofflags_fflags --no-same-permissions --fflags -f nofflags.tar >nofflags_fflags.out 2>nofflags_fflags.err", testprog);
	assertEqualInt(r, 0);
	assertUnequalFflags("f", "nofflags_fflags/f");

	/* Extract nofflags with nofflags */
	assertMakeDir("nofflags_nofflags", 0755);
	clear_fflags("nofflags_nofflags");
	r = systemf("%s -x -C nofflags_nofflags -p --no-fflags -f nofflags.tar >nofflags_nofflags.out 2>nofflags_nofflags.err", testprog);
	assertEqualInt(r, 0);
	assertUnequalFflags("f", "nofflags_nofflags/f");
}